

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat *pMVar5;
  ulong uVar6;
  ParamDict *in_RSI;
  long in_RDI;
  bool bVar7;
  bool bVar8;
  int axes_blob_count;
  int ends_blob_count;
  int starts_blob_count;
  bool numpy_style_slice;
  string *in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffffa04;
  ParamDict *in_stack_fffffffffffffa08;
  undefined6 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa16;
  undefined1 in_stack_fffffffffffffa17;
  char *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  Mat *expr;
  allocator<char> local_501;
  string local_500 [32];
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [32];
  string local_498 [39];
  allocator<char> local_471;
  string local_470 [32];
  string local_450 [32];
  Mat local_430;
  Mat local_3e8;
  Mat local_3a0;
  Mat local_358;
  Mat local_300;
  Mat local_2b8;
  ParamDict *local_270;
  Mat *local_260;
  Mat *local_258;
  Mat *local_250;
  Mat *local_248;
  Mat *local_238;
  Mat *local_228;
  Mat *local_218;
  Mat *local_208;
  Mat *local_1f8;
  int local_1e8;
  undefined4 local_1e4;
  Mat *local_1e0;
  Mat *local_1d8;
  Mat *local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  Mat *local_1c0;
  Mat *local_1b8;
  Mat *local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  Mat *local_1a0;
  Mat *local_198;
  Mat *local_190;
  long *local_188;
  long *local_180;
  int local_178;
  undefined4 local_174;
  Mat *local_170;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  Mat *local_150;
  int local_138;
  undefined4 local_134;
  Mat *local_130;
  int local_118;
  undefined4 local_114;
  Mat *local_110;
  int local_f8;
  undefined4 local_f4;
  Mat *local_f0;
  int local_d8;
  undefined4 local_d4;
  Mat *local_d0;
  int local_b8;
  undefined4 local_b4;
  Mat *local_b0;
  int local_98;
  undefined4 local_94;
  Mat *local_90;
  void *local_78;
  void *local_58;
  void *local_38;
  void *local_28;
  void *local_20;
  void *local_18;
  long *local_10;
  long *local_8;
  
  local_270 = in_RSI;
  iVar2 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get(local_270,1,0);
  *(int *)(in_RDI + 0xd4) = iVar2;
  iVar2 = ParamDict::get(local_270,0xd,0);
  *(int *)(in_RDI + 0xd8) = iVar2;
  iVar2 = ParamDict::get(local_270,2,0);
  *(int *)(in_RDI + 0xdc) = iVar2;
  iVar2 = ParamDict::get(local_270,3,0);
  *(int *)(in_RDI + 0xe0) = iVar2;
  iVar2 = ParamDict::get(local_270,4,0);
  *(int *)(in_RDI + 0xe4) = iVar2;
  iVar2 = ParamDict::get(local_270,0xe,0);
  *(int *)(in_RDI + 0xe8) = iVar2;
  iVar2 = ParamDict::get(local_270,5,0);
  *(int *)(in_RDI + 0xec) = iVar2;
  iVar2 = ParamDict::get(local_270,6,0);
  *(int *)(in_RDI + 0xf0) = iVar2;
  iVar2 = ParamDict::get(local_270,7,0);
  *(int *)(in_RDI + 0xf4) = iVar2;
  iVar2 = ParamDict::get(local_270,0xf,0);
  *(int *)(in_RDI + 0xf8) = iVar2;
  iVar2 = ParamDict::get(local_270,8,0);
  *(int *)(in_RDI + 0xfc) = iVar2;
  local_260 = &local_300;
  local_300.data = (void *)0x0;
  local_300.refcount = (int *)0x0;
  local_300.elemsize = 0;
  local_300.elempack = 0;
  local_300.allocator = (Allocator *)0x0;
  local_300.dims = 0;
  local_300.w = 0;
  local_300.h = 0;
  local_300.d = 0;
  local_300.c = 0;
  local_300.cstep = 0;
  ParamDict::get(&local_2b8,local_270,9,local_260);
  pMVar5 = (Mat *)(in_RDI + 0x100);
  local_1a0 = &local_2b8;
  local_198 = pMVar5;
  if (pMVar5 != local_1a0) {
    if (local_2b8.refcount != (int *)0x0) {
      local_1a4 = 1;
      LOCK();
      local_1a8 = *local_2b8.refcount;
      *local_2b8.refcount = *local_2b8.refcount + 1;
      UNLOCK();
    }
    local_170 = pMVar5;
    if (*(long *)(in_RDI + 0x108) != 0) {
      piVar1 = *(int **)(in_RDI + 0x108);
      local_174 = 0xffffffff;
      LOCK();
      local_178 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_178 == 1) {
        if (*(long *)(in_RDI + 0x120) == 0) {
          local_18 = pMVar5->data;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x120) + 0x18))(*(long **)(in_RDI + 0x120),pMVar5->data)
          ;
        }
      }
    }
    pMVar5->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x128) = 0;
    *(undefined4 *)(in_RDI + 300) = 0;
    *(undefined4 *)(in_RDI + 0x130) = 0;
    *(undefined4 *)(in_RDI + 0x134) = 0;
    *(undefined4 *)(in_RDI + 0x138) = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined8 *)(in_RDI + 0x108) = 0;
    pMVar5->data = local_1a0->data;
    *(int **)(in_RDI + 0x108) = local_1a0->refcount;
    *(size_t *)(in_RDI + 0x110) = local_1a0->elemsize;
    *(int *)(in_RDI + 0x118) = local_1a0->elempack;
    *(Allocator **)(in_RDI + 0x120) = local_1a0->allocator;
    *(int *)(in_RDI + 0x128) = local_1a0->dims;
    *(int *)(in_RDI + 300) = local_1a0->w;
    *(int *)(in_RDI + 0x130) = local_1a0->h;
    *(int *)(in_RDI + 0x134) = local_1a0->d;
    *(int *)(in_RDI + 0x138) = local_1a0->c;
    *(size_t *)(in_RDI + 0x140) = local_1a0->cstep;
  }
  expr = &local_2b8;
  local_248 = expr;
  local_190 = pMVar5;
  local_90 = expr;
  if (local_2b8.refcount != (int *)0x0) {
    local_94 = 0xffffffff;
    LOCK();
    local_98 = *local_2b8.refcount;
    *local_2b8.refcount = *local_2b8.refcount + -1;
    UNLOCK();
    if (local_98 == 1) {
      if (local_2b8.allocator == (Allocator *)0x0) {
        if (local_2b8.data != (void *)0x0) {
          free(local_2b8.data);
        }
      }
      else {
        (*(local_2b8.allocator)->_vptr_Allocator[3])(local_2b8.allocator,local_2b8.data);
      }
    }
  }
  expr->data = (void *)0x0;
  expr->elemsize = 0;
  expr->elempack = 0;
  expr->dims = 0;
  expr->w = 0;
  expr->h = 0;
  expr->d = 0;
  expr->c = 0;
  expr->cstep = 0;
  expr->refcount = (int *)0x0;
  local_238 = &local_300;
  local_b0 = local_238;
  if (local_300.refcount != (int *)0x0) {
    local_b4 = 0xffffffff;
    LOCK();
    local_b8 = *local_300.refcount;
    *local_300.refcount = *local_300.refcount + -1;
    UNLOCK();
    if (local_b8 == 1) {
      if (local_300.allocator == (Allocator *)0x0) {
        local_78 = local_300.data;
        if (local_300.data != (void *)0x0) {
          free(local_300.data);
        }
      }
      else {
        (*(local_300.allocator)->_vptr_Allocator[3])(local_300.allocator,local_300.data);
      }
    }
  }
  local_300.data = (void *)0x0;
  local_300.elemsize = 0;
  local_300.elempack = 0;
  local_300.dims = 0;
  local_300.w = 0;
  local_300.h = 0;
  local_300.d = 0;
  local_300.c = 0;
  local_300.cstep = 0;
  local_300.refcount = (int *)0x0;
  local_258 = &local_3a0;
  local_3a0.data = (void *)0x0;
  local_3a0.refcount = (int *)0x0;
  local_3a0.elemsize = 0;
  local_3a0.elempack = 0;
  local_3a0.allocator = (Allocator *)0x0;
  local_3a0.dims = 0;
  local_3a0.w = 0;
  local_3a0.h = 0;
  local_3a0.d = 0;
  local_3a0.c = 0;
  local_3a0.cstep = 0;
  ParamDict::get(&local_358,local_270,10,local_258);
  pMVar5 = (Mat *)(in_RDI + 0x148);
  local_1c0 = &local_358;
  local_1b8 = pMVar5;
  if (pMVar5 != local_1c0) {
    if (local_358.refcount != (int *)0x0) {
      local_1c4 = 1;
      LOCK();
      local_1c8 = *local_358.refcount;
      *local_358.refcount = *local_358.refcount + 1;
      UNLOCK();
    }
    local_160 = pMVar5;
    if (*(long *)(in_RDI + 0x150) != 0) {
      piVar1 = *(int **)(in_RDI + 0x150);
      local_164 = 0xffffffff;
      LOCK();
      local_168 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_168 == 1) {
        if (*(long *)(in_RDI + 0x168) == 0) {
          local_20 = pMVar5->data;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x168) + 0x18))(*(long **)(in_RDI + 0x168),pMVar5->data)
          ;
        }
      }
    }
    pMVar5->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x170) = 0;
    *(undefined4 *)(in_RDI + 0x174) = 0;
    *(undefined4 *)(in_RDI + 0x178) = 0;
    *(undefined4 *)(in_RDI + 0x17c) = 0;
    *(undefined4 *)(in_RDI + 0x180) = 0;
    *(undefined8 *)(in_RDI + 0x188) = 0;
    *(undefined8 *)(in_RDI + 0x150) = 0;
    pMVar5->data = local_1c0->data;
    *(int **)(in_RDI + 0x150) = local_1c0->refcount;
    *(size_t *)(in_RDI + 0x158) = local_1c0->elemsize;
    *(int *)(in_RDI + 0x160) = local_1c0->elempack;
    *(Allocator **)(in_RDI + 0x168) = local_1c0->allocator;
    *(int *)(in_RDI + 0x170) = local_1c0->dims;
    *(int *)(in_RDI + 0x174) = local_1c0->w;
    *(int *)(in_RDI + 0x178) = local_1c0->h;
    *(int *)(in_RDI + 0x17c) = local_1c0->d;
    *(int *)(in_RDI + 0x180) = local_1c0->c;
    *(size_t *)(in_RDI + 0x188) = local_1c0->cstep;
  }
  local_228 = &local_358;
  local_1b0 = pMVar5;
  local_d0 = local_228;
  if (local_358.refcount != (int *)0x0) {
    local_d4 = 0xffffffff;
    LOCK();
    local_d8 = *local_358.refcount;
    *local_358.refcount = *local_358.refcount + -1;
    UNLOCK();
    if (local_d8 == 1) {
      if (local_358.allocator == (Allocator *)0x0) {
        if (local_358.data != (void *)0x0) {
          free(local_358.data);
        }
      }
      else {
        (*(local_358.allocator)->_vptr_Allocator[3])(local_358.allocator,local_358.data);
      }
    }
  }
  local_358.data = (void *)0x0;
  local_358.elemsize = 0;
  local_358.elempack = 0;
  local_358.dims = 0;
  local_358.w = 0;
  local_358.h = 0;
  local_358.d = 0;
  local_358.c = 0;
  local_358.cstep = 0;
  local_358.refcount = (int *)0x0;
  local_218 = &local_3a0;
  local_f0 = local_218;
  if (local_3a0.refcount != (int *)0x0) {
    local_f4 = 0xffffffff;
    LOCK();
    local_f8 = *local_3a0.refcount;
    *local_3a0.refcount = *local_3a0.refcount + -1;
    UNLOCK();
    if (local_f8 == 1) {
      if (local_3a0.allocator == (Allocator *)0x0) {
        local_58 = local_3a0.data;
        if (local_3a0.data != (void *)0x0) {
          free(local_3a0.data);
        }
      }
      else {
        (*(local_3a0.allocator)->_vptr_Allocator[3])(local_3a0.allocator,local_3a0.data);
      }
    }
  }
  local_3a0.data = (void *)0x0;
  local_3a0.elemsize = 0;
  local_3a0.elempack = 0;
  local_3a0.dims = 0;
  local_3a0.w = 0;
  local_3a0.h = 0;
  local_3a0.d = 0;
  local_3a0.c = 0;
  local_3a0.cstep = 0;
  local_3a0.refcount = (int *)0x0;
  local_250 = &local_430;
  local_430.data = (void *)0x0;
  local_430.refcount = (int *)0x0;
  local_430.elemsize = 0;
  local_430.elempack = 0;
  local_430.allocator = (Allocator *)0x0;
  local_430.dims = 0;
  local_430.w = 0;
  local_430.h = 0;
  local_430.d = 0;
  local_430.c = 0;
  local_430.cstep = 0;
  ParamDict::get(&local_3e8,local_270,0xb,local_250);
  pMVar5 = (Mat *)(in_RDI + 400);
  local_1e0 = &local_3e8;
  local_1d8 = pMVar5;
  if (pMVar5 != local_1e0) {
    if (local_3e8.refcount != (int *)0x0) {
      local_1e4 = 1;
      LOCK();
      local_1e8 = *local_3e8.refcount;
      *local_3e8.refcount = *local_3e8.refcount + 1;
      UNLOCK();
    }
    local_150 = pMVar5;
    if (*(long *)(in_RDI + 0x198) != 0) {
      piVar1 = *(int **)(in_RDI + 0x198);
      local_154 = 0xffffffff;
      LOCK();
      local_158 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_158 == 1) {
        if (*(long *)(in_RDI + 0x1b0) == 0) {
          local_28 = pMVar5->data;
          if (local_28 != (void *)0x0) {
            free(local_28);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x1b0) + 0x18))(*(long **)(in_RDI + 0x1b0),pMVar5->data)
          ;
        }
      }
    }
    pMVar5->data = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
    *(undefined4 *)(in_RDI + 0x1a8) = 0;
    *(undefined4 *)(in_RDI + 0x1b8) = 0;
    *(undefined4 *)(in_RDI + 0x1bc) = 0;
    *(undefined4 *)(in_RDI + 0x1c0) = 0;
    *(undefined4 *)(in_RDI + 0x1c4) = 0;
    *(undefined4 *)(in_RDI + 0x1c8) = 0;
    *(undefined8 *)(in_RDI + 0x1d0) = 0;
    *(undefined8 *)(in_RDI + 0x198) = 0;
    pMVar5->data = local_1e0->data;
    *(int **)(in_RDI + 0x198) = local_1e0->refcount;
    *(size_t *)(in_RDI + 0x1a0) = local_1e0->elemsize;
    *(int *)(in_RDI + 0x1a8) = local_1e0->elempack;
    *(Allocator **)(in_RDI + 0x1b0) = local_1e0->allocator;
    *(int *)(in_RDI + 0x1b8) = local_1e0->dims;
    *(int *)(in_RDI + 0x1bc) = local_1e0->w;
    *(int *)(in_RDI + 0x1c0) = local_1e0->h;
    *(int *)(in_RDI + 0x1c4) = local_1e0->d;
    *(int *)(in_RDI + 0x1c8) = local_1e0->c;
    *(size_t *)(in_RDI + 0x1d0) = local_1e0->cstep;
  }
  local_208 = &local_3e8;
  local_1d0 = pMVar5;
  local_110 = local_208;
  if (local_3e8.refcount != (int *)0x0) {
    local_114 = 0xffffffff;
    LOCK();
    local_118 = *local_3e8.refcount;
    *local_3e8.refcount = *local_3e8.refcount + -1;
    UNLOCK();
    if (local_118 == 1) {
      if (local_3e8.allocator == (Allocator *)0x0) {
        if (local_3e8.data != (void *)0x0) {
          free(local_3e8.data);
        }
      }
      else {
        (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
      }
    }
  }
  local_3e8.data = (void *)0x0;
  local_3e8.elemsize = 0;
  local_3e8.elempack = 0;
  local_3e8.dims = 0;
  local_3e8.w = 0;
  local_3e8.h = 0;
  local_3e8.d = 0;
  local_3e8.c = 0;
  local_3e8.cstep = 0;
  local_3e8.refcount = (int *)0x0;
  local_1f8 = &local_430;
  local_130 = local_1f8;
  if (local_430.refcount != (int *)0x0) {
    local_134 = 0xffffffff;
    LOCK();
    local_138 = *local_430.refcount;
    *local_430.refcount = *local_430.refcount + -1;
    UNLOCK();
    if (local_138 == 1) {
      if (local_430.allocator == (Allocator *)0x0) {
        local_38 = local_430.data;
        if (local_430.data != (void *)0x0) {
          free(local_430.data);
        }
      }
      else {
        (*(local_430.allocator)->_vptr_Allocator[3])(local_430.allocator,local_430.data);
      }
    }
  }
  local_430.data = (void *)0x0;
  local_430.elemsize = 0;
  local_430.elempack = 0;
  local_430.dims = 0;
  local_430.w = 0;
  local_430.h = 0;
  local_430.d = 0;
  local_430.c = 0;
  local_430.cstep = 0;
  local_430.refcount = (int *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),in_stack_fffffffffffffa18
             ,(allocator<char> *)
              CONCAT17(in_stack_fffffffffffffa17,
                       CONCAT16(in_stack_fffffffffffffa16,in_stack_fffffffffffffa10)));
  ParamDict::get(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1d8),local_450);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),in_stack_fffffffffffffa18
             ,(allocator<char> *)
              CONCAT17(in_stack_fffffffffffffa17,
                       CONCAT16(in_stack_fffffffffffffa16,in_stack_fffffffffffffa10)));
  ParamDict::get(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1f8),local_498);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),in_stack_fffffffffffffa18
             ,(allocator<char> *)
              CONCAT17(in_stack_fffffffffffffa17,
                       CONCAT16(in_stack_fffffffffffffa16,in_stack_fffffffffffffa10)));
  ParamDict::get(in_stack_fffffffffffffa08,in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x218),local_4e0);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  local_180 = (long *)(in_RDI + 0x100);
  bVar7 = true;
  if (*local_180 != 0) {
    bVar7 = *(long *)(in_RDI + 0x140) * (long)*(int *)(in_RDI + 0x138) == 0;
    local_10 = local_180;
  }
  bVar8 = false;
  if (!bVar7) {
    local_188 = (long *)(in_RDI + 0x148);
    bVar8 = true;
    if (*local_188 != 0) {
      bVar8 = *(long *)(in_RDI + 0x188) * (long)*(int *)(in_RDI + 0x180) == 0;
      local_8 = local_188;
    }
    bVar8 = (bool)(bVar8 ^ 1);
  }
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) == 0) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
    bVar8 = true;
  }
  if (((((*(int *)(in_RDI + 0xe0) == 0) && (*(int *)(in_RDI + 0xe4) == 0)) &&
       (*(int *)(in_RDI + 0xe8) == 0)) &&
      (((*(int *)(in_RDI + 0xec) == 0 && (*(int *)(in_RDI + 0xf0) == 0)) &&
       ((*(int *)(in_RDI + 0xf4) == 0 &&
        ((*(int *)(in_RDI + 0xf8) == 0 && (*(int *)(in_RDI + 0xfc) == 0)))))))) && (!bVar8)) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  uVar6 = std::__cxx11::string::empty();
  if ((((uVar6 & 1) == 0) || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) ||
     (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
    iVar2 = count_expression_blobs((string *)expr);
    iVar3 = count_expression_blobs((string *)expr);
    iVar4 = count_expression_blobs((string *)expr);
    if (((1 < iVar2) || (1 < iVar3)) || (1 < iVar4)) {
      *(undefined1 *)(in_RDI + 8) = 0;
    }
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    doffset = pd.get(13, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outd = pd.get(14, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    doffset2 = pd.get(15, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    starts_expr = pd.get(19, "");
    ends_expr = pd.get(20, "");
    axes_expr = pd.get(21, "");

    // NCNN_LOGE("%s %s %s", starts_expr.c_str(), ends_expr.c_str(), axes_expr.c_str());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (!starts_expr.empty() && !ends_expr.empty())
        numpy_style_slice = true;

    if (outw == 0 && outh == 0 && outd == 0 && outc == 0 && woffset2 == 0 && hoffset2 == 0 && doffset2 == 0 && coffset2 == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    // count reference blobs
    if (!starts_expr.empty() || !ends_expr.empty() || !axes_expr.empty())
    {
        const int starts_blob_count = count_expression_blobs(starts_expr);
        const int ends_blob_count = count_expression_blobs(ends_expr);
        const int axes_blob_count = count_expression_blobs(axes_expr);

        // NCNN_LOGE("%d %d %d", starts_blob_count, ends_blob_count, axes_blob_count);
        if (starts_blob_count > 1 || ends_blob_count > 1 || axes_blob_count > 1)
            one_blob_only = false;
    }

    return 0;
}